

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bels.c
# Opt level: O0

err_t belsValM(octet *m0,size_t len)

{
  bool_t bVar1;
  err_t eVar2;
  ulong uVar3;
  void *src;
  word *n_00;
  size_t in_RSI;
  void *in_RDI;
  err_t code;
  void *stack;
  word *f0;
  void *state;
  size_t n;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  word *stack_00;
  word *a;
  
  if ((((in_RSI == 0x10) || (in_RSI == 0x18)) || (in_RSI == 0x20)) &&
     (bVar1 = memIsValid(in_RDI,in_RSI), bVar1 != 0)) {
    uVar3 = in_RSI + 7 >> 3;
    src = (void *)(uVar3 + 1);
    ppIsIrred_deep(uVar3 + 1);
    n_00 = (word *)blobCreate((size_t)src);
    if (n_00 == (word *)0x0) {
      return 0x6e;
    }
    stack_00 = n_00 + uVar3 + 1;
    a = n_00;
    u64From((u64 *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),src,0x131876);
    n_00[uVar3] = 1;
    bVar1 = ppIsIrred(a,(size_t)n_00,stack_00);
    eVar2 = 0x1f9;
    if (bVar1 != 0) {
      eVar2 = 0;
    }
    blobClose((blob_t)0x1318bd);
    return eVar2;
  }
  return 0x6d;
}

Assistant:

err_t belsValM(const octet m0[], size_t len)
{
	size_t n;
	void* state;
	word* f0;
	void* stack;
	err_t code;
	// проверить входные данные
	if ((len != 16 && len != 24 && len != 32) || !memIsValid(m0, len))
		return ERR_BAD_INPUT;
	// создать состояние
	n = W_OF_O(len);
	state = blobCreate(n + 1 + ppIsIrred_deep(n + 1));
	if (state == 0)
		return ERR_OUTOFMEMORY;
	// раскладка состояния
	f0 = (word*)state;
	stack = f0 + n + 1;
	// загрузить многочлен
	wwFrom(f0, m0, len);
	f0[n] = 1;
	// неприводим?
	code = ppIsIrred(f0, n + 1, stack) ? ERR_OK : ERR_BAD_PUBKEY;
	// завершение
	blobClose(state);
	return code;
}